

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O0

string_view RenX::translateWinType(WinType winType)

{
  string_view sVar1;
  size_t sStack_18;
  WinType winType_local;
  char *local_10;
  
  switch(winType) {
  case Score:
    sStack_18 = scoreWinTypeTranslation._M_len;
    local_10 = scoreWinTypeTranslation._M_str;
    break;
  case Base:
    sStack_18 = baseWinTypeTranslation._M_len;
    local_10 = baseWinTypeTranslation._M_str;
    break;
  case Beacon:
    sStack_18 = beaconWinTypeTranslation._M_len;
    local_10 = beaconWinTypeTranslation._M_str;
    break;
  case Tie:
    sStack_18 = tieWinTypeTranslation._M_len;
    local_10 = tieWinTypeTranslation._M_str;
    break;
  case Shutdown:
    sStack_18 = shutdownWinTypeTranslation._M_len;
    local_10 = shutdownWinTypeTranslation._M_str;
    break;
  case Surrender:
    sStack_18 = surrenderWinTypeTranslation._M_len;
    local_10 = surrenderWinTypeTranslation._M_str;
    break;
  case Unknown:
  default:
    sStack_18 = unknownWinTypeTranslation._M_len;
    local_10 = unknownWinTypeTranslation._M_str;
  }
  sVar1._M_str = local_10;
  sVar1._M_len = sStack_18;
  return sVar1;
}

Assistant:

std::string_view RenX::translateWinType(RenX::WinType winType)
{
	switch (winType)
	{
	case RenX::WinType::Score:
		return scoreWinTypeTranslation;
	case RenX::WinType::Base:
		return baseWinTypeTranslation;
	case RenX::WinType::Beacon:
		return beaconWinTypeTranslation;
	case RenX::WinType::Tie:
		return tieWinTypeTranslation;
	case RenX::WinType::Shutdown:
		return shutdownWinTypeTranslation;
	case RenX::WinType::Surrender:
		return surrenderWinTypeTranslation;
	case RenX::WinType::Unknown:
	default:
		return unknownWinTypeTranslation;
	}
}